

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O0

size_t __thiscall
mocker::LoopInvariantCodeMotion::processLoop(LoopInvariantCodeMotion *this,size_t header)

{
  __node_base_ptr loopNodes_00;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  undefined1 local_a8 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  invariant;
  undefined1 local_60 [8];
  UseDefChain useDef;
  mapped_type *loopNodes;
  size_t header_local;
  LoopInvariantCodeMotion *this_local;
  
  loopNodes = (mapped_type *)header;
  header_local = (size_t)this;
  this_00 = LoopInfo::getLoops(&this->loopTree);
  useDef.chain._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::at(this_00,(key_type *)&loopNodes);
  sVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)useDef.chain._M_h._M_single_bucket);
  if (sVar1 == 1) {
    this_local = (LoopInvariantCodeMotion *)0x0;
  }
  else {
    UseDefChain::UseDefChain((UseDefChain *)local_60);
    UseDefChain::init((UseDefChain *)local_60,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
    findLoopInvariantComputation
              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)local_a8,this,(size_t)loopNodes,(UseDefChain *)local_60);
    loopNodes_00 = useDef.chain._M_h._M_single_bucket;
    pmVar2 = std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::at(&this->preHeaders,(key_type *)&loopNodes);
    hoist(this,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)loopNodes_00,
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)local_a8,*pmVar2);
    this_local = (LoopInvariantCodeMotion *)
                 std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_a8);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_a8);
    UseDefChain::~UseDefChain((UseDefChain *)local_60);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t LoopInvariantCodeMotion::processLoop(const std::size_t header) {
  const auto &loopNodes = loopTree.getLoops().at(header);
  if (loopNodes.size() == 1)
    return 0;

  UseDefChain useDef;
  useDef.init(func);
  auto invariant = findLoopInvariantComputation(header, useDef);
  hoist(loopNodes, invariant, preHeaders.at(header));
  return invariant.size();
}